

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareRootUnscentedKalmanFilter.cpp
# Opt level: O2

void __thiscall
SquareRootUnscentedKalmanFilter_updateStateCovariance_Test::TestBody
          (SquareRootUnscentedKalmanFilter_updateStateCovariance_Test *this)

{
  T *this_00;
  float fVar1;
  bool bVar2;
  ComputationInfo CVar3;
  CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *pCVar4;
  CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *pCVar5;
  Scalar *pSVar6;
  long row;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  AssertionResult *this_02;
  char *pcVar7;
  char *in_R9;
  long col;
  undefined1 local_1f4 [8];
  SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  Matrix<T,_2,_2> Ssquared;
  Cholesky<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> S_y;
  double local_e0;
  Matrix<T,_3,_3> P_ref;
  Matrix<T,_3,_2> K;
  Matrix<T,_3,_3> P;
  undefined1 local_70 [8];
  AssertionResult gtest_ar__1;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [2];
  AssertHelper local_38;
  
  Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
  SquareRootUnscentedKalmanFilter
            ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_1f4,1.0,2.0,1.0);
  K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_ =
       &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
        super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
        super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized = false;
  ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
  super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
  super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>._41_3_ = 0x3f8000;
  local_e0 = (double)CONCAT44(local_e0._4_4_,0x3dcccccd);
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
                      (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                       m_data.array + 4),(Scalar *)&local_e0);
  local_70._0_4_ = 0.1;
  pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
                     (pCVar4,(Scalar *)local_70);
  Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2] =
       0.5;
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::operator_
            (pCVar4,Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.
                    m_data.array + 2);
  Eigen::CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_2,_2,_0,_2,_2>_> *)
             (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array +
             4));
  local_e0 = 0.1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>
                    *)(K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                       m_data.array + 4),&local_e0,
                   (StorageBaseType *)
                   &ukf.super_SquareRootFilterBase<Kalman::Vector<float,_3>_>.
                    super_SquareRootBase<Kalman::Vector<float,_3>_>.S.
                    super_LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>.m_isInitialized);
  Eigen::LLT<Eigen::Matrix<float,2,2,0,2,2>,1>::
  compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,2,2,0,2,2>const>const,Eigen::Matrix<float,2,2,0,2,2>const>>
            ((LLT<Eigen::Matrix<float,2,2,0,2,2>,1> *)
             (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
              array + 2),
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>,_const_Eigen::Matrix<float,_2,_2,_0,_2,_2>_>_>
              *)(K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                 array + 4));
  CVar3 = Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::info
                    ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)
                     (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage
                      .m_data.array + 2));
  this_02 = (AssertionResult *)&P_ref;
  P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  local_e0 = (double)CONCAT71(local_e0._1_7_,CVar3 == Success);
  if (CVar3 == Success) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this_02);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_ =
         P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array +
         8;
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] =
         0.17840852;
    local_e0 = (double)CONCAT44(local_e0._4_4_,0xbe9bb3b5);
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
                        (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.
                         m_data.array + 4),(Scalar *)&local_e0);
    local_70._0_4_ = -1.1109985;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,(Scalar *)local_70);
    local_48[0].ptr_._0_4_ = 0x3f4d86d0;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,(Scalar *)local_48);
    local_38.data_._0_4_ = 0xbf9f820e;
    pCVar5 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
                       (pCVar5,(Scalar *)&local_38);
    P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] =
         0.063524246;
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::operator_
              (pCVar5,P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                      m_data.array + 7);
    Eigen::CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>::finished
              ((CommaInitializer<Eigen::Matrix<float,_3,_2,_0,_3,_2>_> *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4));
    this_00 = &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma;
    Kalman::Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::setIdentity
              ((Cholesky<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)this_00);
    Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
              ((MatrixType *)local_70,(LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)this_00);
    Eigen::LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1>::reconstructedMatrix
              ((LLT<Eigen::Matrix<float,_2,_2,_0,_2,_2>,_1> *)local_48);
    K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array._16_8_ =
         (MatrixType *)local_70;
    Eigen::PlainObjectBase<Eigen::Matrix<float,3,3,0,3,3>>::
    _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,3,0,3,3>const,Eigen::Product<Eigen::Product<Eigen::Matrix<float,3,2,0,3,2>,Eigen::Matrix<float,2,2,0,2,2>,0>,Eigen::Transpose<Eigen::Matrix<float,3,2,0,3,2>>,0>const>>
              ((PlainObjectBase<Eigen::Matrix<float,3,3,0,3,3>> *)&local_e0,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>,_const_Eigen::Product<Eigen::Product<Eigen::Matrix<float,_3,_2,_0,_3,_2>,_Eigen::Matrix<float,_2,_2,_0,_2,_2>,_0>,_Eigen::Transpose<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>,_0>_>_>
                *)(K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                   array + 4));
    bVar2 = Kalman::SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_>::
            updateStateCovariance<Kalman::Vector<float,_2>_>
                      ((SquareRootUnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_1f4,
                       (KalmanGain<Kalman::Vector<float,_2>_> *)
                       (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.
                        m_data.array + 8),
                       (CovarianceSquareRoot<Kalman::Vector<float,_2>_> *)
                       (Ssquared.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.
                        m_storage.m_data.array + 2));
    this_02 = &gtest_ar__1;
    local_70[0] = (internal)bVar2;
    gtest_ar__1.success_ = false;
    gtest_ar__1._1_7_ = 0;
    if (bVar2) {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)this_02);
      Eigen::LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::reconstructedMatrix
                ((MatrixType *)
                 (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.
                  array + 4),(LLT<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)this_00);
      local_48[0].ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
      local_38.data_ = (AssertHelperData *)0x3;
      testing::internal::CmpHelperEQ<long,long>
                ((internal *)local_70,"P_ref.rows()","P.rows()",(long *)local_48,(long *)&local_38);
      if (local_70[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_48);
        if (gtest_ar__1._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar__1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                   ,0xb5,pcVar7);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_48);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&gtest_ar__1);
        local_48[0].ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
        local_38.data_ = (AssertHelperData *)0x3;
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)local_70,"P_ref.cols()","P.cols()",(long *)local_48,(long *)&local_38
                  );
        if (local_70[0] != (internal)0x0) {
          testing::internal::
          scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar__1);
          row = 0;
          do {
            if (row == 3) {
              return;
            }
            for (col = 0; col != 3; col = col + 1) {
              pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                                  &local_e0,row,col);
              fVar1 = *pSVar6;
              pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1> *)
                                  (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.
                                   m_storage.m_data.array + 4),row,col);
              testing::internal::DoubleNearPredFormat
                        ((internal *)local_70,"P_ref(i,j)","P(i,j)","1e-6",(double)fVar1,
                         (double)*pSVar6,1e-06);
              if (local_70[0] == (internal)0x0) {
                testing::Message::Message((Message *)local_48);
                if (gtest_ar__1._0_8_ == 0) {
                  pcVar7 = "";
                }
                else {
                  pcVar7 = *(char **)gtest_ar__1._0_8_;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_38,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                           ,0xb5,pcVar7);
                testing::internal::AssertHelper::operator=(&local_38,(Message *)local_48);
                testing::internal::AssertHelper::~AssertHelper(&local_38);
                testing::internal::
                scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~scoped_ptr(local_48);
                this_02 = &gtest_ar__1;
                goto LAB_001909f9;
              }
              testing::internal::
              scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)&gtest_ar__1);
            }
            row = row + 1;
          } while( true );
        }
        testing::Message::Message((Message *)local_48);
        if (gtest_ar__1._0_8_ == 0) {
          pcVar7 = "";
        }
        else {
          pcVar7 = *(char **)gtest_ar__1._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
                   ,0xb5,pcVar7);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)local_48);
      }
      this_02 = &gtest_ar__1;
      testing::internal::AssertHelper::~AssertHelper(&local_38);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr(local_48);
      goto LAB_001909f9;
    }
    testing::Message::Message((Message *)local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4),(internal *)local_70,(AssertionResult *)"success","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xb1,(char *)K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                             .m_data.array._16_8_);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    std::__cxx11::string::~string
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4));
    this_01 = local_48;
  }
  else {
    testing::Message::Message((Message *)local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4),(internal *)&local_e0,(AssertionResult *)"S_y.info() == Eigen::Success","false",
               "true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/SquareRootUnscentedKalmanFilter.cpp"
               ,0xa0,(char *)K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage
                             .m_data.array._16_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),(Message *)local_70);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               (P_ref.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    std::__cxx11::string::~string
              ((string *)
               (K.super_PlainObjectBase<Eigen::Matrix<float,_3,_2,_0,_3,_2>_>.m_storage.m_data.array
               + 4));
    this_01 = (scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_70;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(this_01);
LAB_001909f9:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)this_02);
  return;
}

Assistant:

TEST(SquareRootUnscentedKalmanFilter, updateStateCovariance) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = SquareRootUnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Setup S_y
    Matrix<T,2,2> Ssquared;
    Ssquared <<
        1, 0.1,
        0.1, 0.5;
    Cholesky<Matrix<T,2,2>> S_y;
    S_y.compute(0.1*Ssquared);
    ASSERT_TRUE(S_y.info() == Eigen::Success);
    
    // Setup Kalman Gain
    Matrix<T, 3, 2> K;
    K <<
        0.178408514951850, -0.304105423213381,
       -1.110998479472884,  0.802838317283324,
       -1.246156445345498,  0.063524243960128;
    
    // Setup S
    ukf.S.setIdentity();
    
    // Setup reference value for S (computed from regular UKF formula)
    Matrix<T,3,3> P_ref = ukf.S.reconstructedMatrix() - K * S_y.reconstructedMatrix() * K.transpose();

    // Perform update
    bool success = ukf.updateStateCovariance<Vector<T,2>>(K, S_y);
    ASSERT_TRUE(success);

    Matrix<T,3,3> P = ukf.S.reconstructedMatrix();
    
    ASSERT_MATRIX_NEAR(P_ref, P, 1e-6);
}